

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O0

void prvTidyRemoveAnchorByNode(TidyDocImpl *doc,ctmbstr name,Node *node)

{
  int iVar1;
  uint local_44;
  Anchor *pAStack_40;
  uint h;
  Anchor *prev;
  Anchor *curr;
  Anchor *delme;
  TidyAttribImpl *attribs;
  Node *node_local;
  ctmbstr name_local;
  TidyDocImpl *doc_local;
  
  curr = (Anchor *)0x0;
  pAStack_40 = (Anchor *)0x0;
  iVar1 = prvTidyHTMLVersion(doc);
  if (iVar1 == 0x20000) {
    local_44 = anchorNameHash5(name);
  }
  else {
    local_44 = anchorNameHash(name);
  }
  prev = (doc->attribs).anchor_hash[local_44];
  do {
    if (prev == (Anchor *)0x0) {
LAB_0012c0f8:
      FreeAnchor(doc,curr);
      return;
    }
    if (prev->node == node) {
      if (pAStack_40 == (Anchor *)0x0) {
        (doc->attribs).anchor_hash[local_44] = prev->next;
      }
      else {
        pAStack_40->next = prev->next;
      }
      curr = prev;
      goto LAB_0012c0f8;
    }
    pAStack_40 = prev;
    prev = prev->next;
  } while( true );
}

Assistant:

void TY_(RemoveAnchorByNode)( TidyDocImpl* doc, ctmbstr name, Node *node )
{
    TidyAttribImpl* attribs = &doc->attribs;
    Anchor *delme = NULL, *curr, *prev = NULL;
    uint h;
    if (TY_(HTMLVersion)(doc) == HT50)
        h = anchorNameHash5(name);
    else
        h = anchorNameHash(name);

    for ( curr=attribs->anchor_hash[h]; curr!=NULL; curr=curr->next )
    {
        if ( curr->node == node )
        {
            if ( prev )
                prev->next = curr->next;
            else
                attribs->anchor_hash[h] = curr->next;
            delme = curr;
            break;
        }
        prev = curr;
    }
    FreeAnchor( doc, delme );
}